

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void sort1d_ascending(double *v,int N,int *pos)

{
  void *__base;
  long lVar1;
  int iVar2;
  ulong __nmemb;
  
  if (0 < N) {
    __nmemb = (ulong)(uint)N;
    __base = malloc(__nmemb << 4);
    lVar1 = 0;
    iVar2 = 0;
    do {
      *(long *)((long)__base + lVar1 * 2) = (long)v + lVar1;
      *(int *)((long)__base + lVar1 * 2 + 8) = iVar2;
      iVar2 = iVar2 + 1;
      lVar1 = lVar1 + 8;
    } while (__nmemb * 8 - lVar1 != 0);
    qsort(__base,__nmemb,0x10,compare_ascending);
    lVar1 = 0;
    do {
      *(undefined4 *)((long)pos + lVar1) = *(undefined4 *)((long)__base + lVar1 * 4 + 8);
      lVar1 = lVar1 + 4;
    } while (__nmemb << 2 != lVar1);
    free(__base);
    return;
  }
  return;
}

Assistant:

void sort1d_ascending(double* v,int N, int* pos)
{
    vipair* val = NULL;
    int i;

    if (N <= 0)
        return;

    val = malloc(sizeof(vipair) * N);

    for (i = 0; i < N; ++i) {
        val[i].a = &v[i];
        val[i].b = i;
    }

    qsort(val, N, sizeof(vipair), compare_ascending);

    for (i = 0; i < N; ++i)
        pos[i] = val[i].b;

    free(val);
}